

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
common::
make_map<int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>
::make_map(make_map<int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>
           *this,int *key,
          vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>
          *val)

{
  mapped_type *this_00;
  vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>
  *val_local;
  int *key_local;
  make_map<int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>
  *this_local;
  
  std::
  map<int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>_>_>
  ::map(&this->map);
  this_00 = std::
            map<int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>_>_>_>
            ::operator[](&this->map,key);
  std::
  vector<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>,_std::allocator<std::vector<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>_>_>
  ::operator=(this_00,val);
  return;
}

Assistant:

make_map(K const& key, V const& val) {
            map[key] = val;
        }